

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMesh.cpp
# Opt level: O0

size_t __thiscall COLLADAFW::Mesh::getNormalsCount(Mesh *this)

{
  MeshPrimitiveWithFaceVertexCount<unsigned_int> *this_00;
  PrimitiveType PVar1;
  MeshPrimitiveArray *this_01;
  size_t sVar2;
  MeshPrimitive **ppMVar3;
  UIntValuesArray *this_02;
  VertexCountArray *this_03;
  size_t sVar4;
  uint *puVar5;
  Mesh *in_RDI;
  size_t indexCount;
  size_t groupedVtxIndex;
  size_t groupedVtxCount;
  VertexCountArray *vertexCountArray;
  MeshPrimitiveWithFaceVertexCount<unsigned_int> *trifans;
  UIntValuesArray *normalIndices;
  MeshPrimitive *meshPrimitive;
  size_t i;
  size_t count;
  MeshPrimitiveArray *meshPrimitives;
  size_t numNormals;
  undefined8 local_58;
  undefined8 local_28;
  undefined8 local_10;
  
  local_10 = 0;
  this_01 = getMeshPrimitives(in_RDI);
  sVar2 = ArrayPrimitiveType<COLLADAFW::MeshPrimitive_*>::getCount(this_01);
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    ppMVar3 = ArrayPrimitiveType<COLLADAFW::MeshPrimitive_*>::operator[](this_01,local_28);
    this_00 = (MeshPrimitiveWithFaceVertexCount<unsigned_int> *)*ppMVar3;
    this_02 = MeshPrimitive::getNormalIndices((MeshPrimitive *)this_00);
    PVar1 = MeshPrimitive::getPrimitiveType((MeshPrimitive *)this_00);
    if (PVar1 == TRIANGLE_FANS || PVar1 == TRIANGLE_STRIPS) {
      this_03 = MeshPrimitiveWithFaceVertexCount<unsigned_int>::getGroupedVerticesVertexCountArray
                          (this_00);
      sVar4 = ArrayPrimitiveType<unsigned_int>::getCount(this_03);
      for (local_58 = 0; local_58 < sVar4; local_58 = local_58 + 1) {
        puVar5 = ArrayPrimitiveType<unsigned_int>::operator[](this_03,local_58);
        local_10 = ((ulong)*puVar5 - 2) * 3 + local_10;
      }
    }
    else {
      sVar4 = ArrayPrimitiveType<unsigned_int>::getCount(this_02);
      local_10 = sVar4 + local_10;
    }
  }
  return local_10;
}

Assistant:

const size_t Mesh::getNormalsCount() const
    {
        // The number of normals in the current mesh.
        size_t numNormals = 0;

        // We have to go through every mesh primitive.
        const MeshPrimitiveArray& meshPrimitives = this->getMeshPrimitives ();
        size_t count = meshPrimitives.getCount ();
        for ( size_t i=0; i<count; ++i )
        {
            // Get the current primitive element.
            const MeshPrimitive* meshPrimitive = meshPrimitives [ i ];

            // Get the normal indices of the current primitive.
            const UIntValuesArray& normalIndices = meshPrimitive->getNormalIndices ();

            switch ( meshPrimitive->getPrimitiveType () )
            {
            case COLLADAFW::MeshPrimitive::TRIANGLE_FANS:
            case COLLADAFW::MeshPrimitive::TRIANGLE_STRIPS:
                {
                    COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>* trifans = (COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>*) meshPrimitive;
                    COLLADAFW::MeshPrimitiveWithFaceVertexCount<unsigned int>::VertexCountArray& vertexCountArray = trifans->getGroupedVerticesVertexCountArray ();
                    size_t groupedVtxCount = vertexCountArray.getCount ();
                    for ( size_t groupedVtxIndex=0; groupedVtxIndex<groupedVtxCount; ++groupedVtxIndex )
                    {
                        // Iterate over the indices and write their normal values into the maya file.
                        size_t indexCount = vertexCountArray[groupedVtxIndex]; //normalIndices.getCount();
                        numNormals += (indexCount - 2) * 3;
                    }
                }
                break;
            default:
                {
                    // Add the normals to the sum of normals
                    numNormals += normalIndices.getCount ();
                }
            }
        }

        return numNormals;
    }